

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

Matrix<double> * __thiscall
nnad::Matrix<double>::operator*
          (Matrix<double> *__return_storage_ptr__,Matrix<double> *this,Matrix<double> *term)

{
  int iVar1;
  double dVar2;
  int c2;
  int l1;
  double value;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  string local_58;
  double local_38;
  
  local_5c = this->_Lines;
  iVar1 = this->_Columns;
  local_60 = term->_Columns;
  if (iVar1 != term->_Lines) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Lines or Columns don\'t match multiplying the two matrices.",
               (allocator<char> *)&local_68);
    Error(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  local_58._M_dataplus._M_p._0_4_ = 0xffffffff;
  Matrix(__return_storage_ptr__,&local_5c,&local_60,(int *)&local_58);
  for (local_68 = 0; local_68 < local_60; local_68 = local_68 + 1) {
    for (local_6c = 0; local_6c < local_5c; local_6c = local_6c + 1) {
      local_58._M_dataplus._M_p = (pointer)0x0;
      for (local_64 = 0; local_64 < iVar1; local_64 = local_64 + 1) {
        local_38 = (this->_Matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->_Columns * local_6c + local_64];
        dVar2 = GetElement(term,&local_64,&local_68);
        local_58._M_dataplus._M_p = (pointer)(local_38 * dVar2 + local_58._M_dataplus._M_p);
      }
      SetElement(__return_storage_ptr__,&local_6c,&local_68,(double *)&local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> operator * (Matrix<T> const& term) const
    {
      const int l1 = _Lines;
      const int c1 = _Columns;
      const int l2 = term.GetLines();
      const int c2 = term.GetColumns();
      if (c1 != l2)
        Error("Lines or Columns don't match multiplying the two matrices.");

      Matrix result{l1, c2};
      for (int i = 0; i < c2; i++)
        for (int j = 0; j < l1; j++)
          {
            T value = T(0);
            for (int k = 0; k < c1; k++)
              value += _Matrix[j * _Columns + k] * term.GetElement(k, i);

            result.SetElement(j, i, value);
          }

      return result;
    }